

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robust_statistics.h
# Opt level: O2

float highwayhash::MedianAbsoluteDeviation<float>
                (vector<float,_std::allocator<float>_> *samples,float median)

{
  pointer pfVar1;
  pointer pfVar2;
  float *pfVar3;
  float *pfVar4;
  float fVar5;
  float local_3c;
  vector<float,_std::allocator<float>_> abs_deviations;
  
  pfVar1 = (samples->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pfVar2 = (samples->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pfVar1 != pfVar2) {
    abs_deviations.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
    ._M_end_of_storage = (pointer)0x0;
    abs_deviations.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
    ._M_start = (pointer)0x0;
    abs_deviations.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
    ._M_finish = (pointer)0x0;
    std::vector<float,_std::allocator<float>_>::reserve
              (&abs_deviations,(long)pfVar2 - (long)pfVar1 >> 2);
    pfVar3 = (samples->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    for (pfVar4 = (samples->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                  super__Vector_impl_data._M_start; pfVar4 != pfVar3; pfVar4 = pfVar4 + 1) {
      local_3c = ABS(*pfVar4 - median);
      std::vector<float,_std::allocator<float>_>::emplace_back<float>(&abs_deviations,&local_3c);
    }
    fVar5 = Median<float>(&abs_deviations);
    std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
              (&abs_deviations.super__Vector_base<float,_std::allocator<float>_>);
    return fVar5;
  }
  __assert_fail("!samples.empty()",
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]highwayhash/highwayhash/robust_statistics.h"
                ,0x7c,
                "T highwayhash::MedianAbsoluteDeviation(const std::vector<T> &, const T) [T = float]"
               );
}

Assistant:

T MedianAbsoluteDeviation(const std::vector<T>& samples, const T median) {
  assert(!samples.empty());
  std::vector<T> abs_deviations;
  abs_deviations.reserve(samples.size());
  for (const T sample : samples) {
    abs_deviations.push_back(std::abs(sample - median));
  }
  return Median(&abs_deviations);
}